

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2skin.cpp
# Opt level: O0

void rw::ps2::skinPreCB(MatPipeline *param_1,Geometry *geo)

{
  uint8 *puVar1;
  float *__src;
  Skin *this;
  float *invMats;
  uint8 *data;
  Skin *skin;
  Geometry *geo_local;
  MatPipeline *param_0_local;
  
  this = Skin::get(geo);
  if (this != (Skin *)0x0) {
    puVar1 = this->data;
    __src = this->inverseMatrices;
    Skin::init(this,(EVP_PKEY_CTX *)(ulong)(uint)this->numBones);
    memcpy(this->inverseMatrices,__src,(long)(this->numBones << 6));
    (*DAT_00168638)(puVar1);
  }
  return;
}

Assistant:

void
skinPreCB(MatPipeline*, Geometry *geo)
{
	Skin *skin = Skin::get(geo);
	if(skin == nil)
		return;
	uint8 *data = skin->data;
	float *invMats = skin->inverseMatrices;
	// meshHeader->totalIndices is highest possible number of vertices again
	skin->init(skin->numBones, skin->numBones, geo->meshHeader->totalIndices);
	memcpy(skin->inverseMatrices, invMats, skin->numBones*64);
	rwFree(data);
}